

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isNotInConcatenationExpr(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,kind) - 0x89;
  if ((((0x2d < uVar1) || ((0x200800000003U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
      ((0x26 < CONCAT22(in_register_0000003a,kind) ||
       ((0x4000080002U >> ((ulong)CONCAT22(in_register_0000003a,kind) & 0x3f) & 1) == 0)))) &&
     ((CONCAT22(in_register_0000003a,kind) != 0x118 &&
      (CONCAT22(in_register_0000003a,kind) != 0x13b)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isNotInConcatenationExpr(TokenKind kind) {
    switch (kind) {
        case TokenKind::Semicolon:
        case TokenKind::EndOfFile:
        case TokenKind::IfKeyword:
        case TokenKind::ForeachKeyword:
        case TokenKind::SoftKeyword:
        case TokenKind::UniqueKeyword:
        case TokenKind::DistKeyword:
        case TokenKind::DisableKeyword:
        case TokenKind::MinusArrow:
            return true;
        default:
            return false;
    }
}